

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAgglomerateEl.h
# Opt level: O0

REAL __thiscall TPZAgglomerateElement::InnerRadius(TPZAgglomerateElement *this)

{
  int64_t iVar1;
  TPZCompEl *pTVar2;
  TPZAgglomerateElement *pTVar3;
  long *in_RDI;
  double dVar4;
  int64_t i;
  TPZCompElDisc *disc;
  REAL value;
  int64_t nsubel;
  double in_stack_ffffffffffffffb8;
  TPZAgglomerateElement *in_stack_ffffffffffffffc0;
  long local_28;
  double local_18;
  
  iVar1 = NIndexes((TPZAgglomerateElement *)0x1bf9bd8);
  local_18 = 0.0;
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    pTVar2 = SubElement(in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8);
    if (pTVar2 == (TPZCompEl *)0x0) {
      pTVar3 = (TPZAgglomerateElement *)0x0;
    }
    else {
      pTVar3 = (TPZAgglomerateElement *)
               __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
    }
    in_stack_ffffffffffffffc0 = pTVar3;
    in_stack_ffffffffffffffb8 =
         (double)(**(code **)(*(long *)&(pTVar3->super_TPZCompElDisc).super_TPZInterpolationSpace.
                                        super_TPZCompEl + 0x2d0))();
    dVar4 = (double)(**(code **)(*(long *)&(pTVar3->super_TPZCompElDisc).super_TPZInterpolationSpace
                                           .super_TPZCompEl + 0x60))();
    local_18 = in_stack_ffffffffffffffb8 * dVar4 + local_18;
  }
  dVar4 = (double)(**(code **)(*in_RDI + 0x60))();
  return local_18 / dVar4;
}

Assistant:

REAL InnerRadius() override {
		int64_t nsubel = this->NIndexes();
		REAL value = 0.;
		TPZCompElDisc * disc;
		for (int64_t i = 0; i < nsubel; i++){
			disc = dynamic_cast<TPZCompElDisc *>(this->SubElement(i) );
#ifdef PZDEBUG
			if (!disc) {
				PZError << "TPZAgglomerateElement::InnerRadius FineElement must be a TPZCompElDisc" << std::endl;
				exit (-1);
			}
#endif
			value += disc->InnerRadius() * disc->VolumeOfEl();
		}
		value = value / this->VolumeOfEl();
		return value;  
	}